

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O2

void cleanUpExecutedProcess
               (ProcessDelegate *delegate,ProcessGroup *pgrp,llbuild_pid_t pid,ProcessHandle handle,
               ProcessContext *ctx,ProcessCompletionFn *completionFn,ManagedDescriptor *releaseFd)

{
  ProcessContext *pPVar1;
  uint64_t uVar2;
  __pid_t _Var3;
  int *piVar4;
  char *Str;
  int __fd;
  uint uVar5;
  int exitCode;
  ProcessContext *local_190;
  uint64_t local_188;
  _Any_data *local_180;
  Child local_178;
  undefined8 uStack_170;
  uint64_t local_168;
  uint64_t uStack_160;
  uint64_t local_158;
  ProcessResult processResult;
  Twine local_120;
  Twine local_108;
  Twine local_f0;
  Twine local_d8;
  rusage usage;
  
  local_190 = ctx;
  local_188 = handle.id;
  local_180 = (_Any_data *)completionFn;
  do {
    piVar4 = &exitCode;
    _Var3 = wait4(pid,&exitCode,0,(rusage *)&usage);
    __fd = (int)piVar4;
    if (_Var3 != -1) {
      ManagedDescriptor::close(releaseFd,__fd);
      llbuild::basic::ProcessGroup::remove(pgrp,(char *)(ulong)(uint)pid);
      processResult.utime = usage.ru_utime.tv_sec * 1000000 + usage.ru_utime.tv_usec;
      processResult.stime = usage.ru_stime.tv_sec * 1000000 + usage.ru_stime.tv_usec;
      uVar5 = exitCode & 0x7f;
      if ((int)(uVar5 * 0x1000000 + 0x1000000) < 0x2000000) {
LAB_0015f37e:
        processResult.status = (ProcessStatus)(exitCode != 0);
      }
      else {
        processResult.status = Cancelled;
        if ((uVar5 != 2) && (uVar5 != 9)) goto LAB_0015f37e;
      }
      processResult.exitCode = exitCode;
      processResult.maxrss = usage.field_2.ru_maxrss;
      processResult.pid = pid;
      (*delegate->_vptr_ProcessDelegate[5])(delegate,local_190,local_188,&processResult);
      local_178._4_4_ = processResult.exitCode;
      local_178.decI = processResult.status;
      uStack_170 = CONCAT44(processResult._12_4_,processResult.pid);
      goto LAB_0015f3d8;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  ManagedDescriptor::close(releaseFd,__fd);
  llbuild::basic::ProcessGroup::remove(pgrp,(char *)(ulong)(uint)pid);
  processResult.status = Failed;
  processResult.exitCode = exitCode;
  processResult.pid = -1;
  processResult.utime = 0;
  processResult.stime = 0;
  processResult.maxrss = 0;
  llvm::Twine::Twine(&local_f0,"unable to wait for process (");
  Str = strerror(*piVar4);
  llvm::Twine::Twine(&local_108,Str);
  llvm::Twine::concat(&local_d8,&local_f0,&local_108);
  llvm::Twine::Twine(&local_120,")");
  llvm::Twine::concat((Twine *)&local_178,&local_d8,&local_120);
  uVar2 = local_188;
  pPVar1 = local_190;
  (*delegate->_vptr_ProcessDelegate[3])(delegate,local_190,local_188,&local_178);
  (*delegate->_vptr_ProcessDelegate[5])(delegate,pPVar1,uVar2,&processResult);
  local_178._4_4_ = processResult.exitCode;
  local_178.decI = processResult.status;
  uStack_170 = CONCAT44(processResult._12_4_,processResult.pid);
LAB_0015f3d8:
  local_168 = processResult.utime;
  uStack_160 = processResult.stime;
  local_158 = processResult.maxrss;
  if (*(long *)(local_180 + 1) != 0) {
    (**(code **)((long)local_180 + 0x18))(local_180,(ProcessResult *)&local_178);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

static void cleanUpExecutedProcess(ProcessDelegate& delegate,
                                   ProcessGroup& pgrp, llbuild_pid_t pid,
                                   ProcessHandle handle, ProcessContext* ctx,
                                   ProcessCompletionFn&& completionFn,
                                   ManagedDescriptor& releaseFd) {
#if defined(_WIN32)
  FILETIME creationTime;
  FILETIME exitTime;
  FILETIME utimeTicks;
  FILETIME stimeTicks;
  int waitResult = WaitForSingleObject(pid, INFINITE);
  int err = GetLastError();
  DWORD exitCode = 0;
  GetExitCodeProcess(pid, &exitCode);

  if (waitResult == WAIT_FAILED || waitResult == WAIT_ABANDONED) {
    releaseFd.close();
    auto result = ProcessResult::makeFailed(exitCode);
    delegate.processHadError(ctx, handle,
                             Twine("unable to wait for process (") +
                                 sys::strerror(GetLastError()) + ")");
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }
#else
  // Wait for the command to complete.
  struct rusage usage;
  int exitCode, result = wait4(pid, &exitCode, 0, &usage);
  while (result == -1 && errno == EINTR)
    result = wait4(pid, &exitCode, 0, &usage);
#endif
  // Close the release pipe
  //
  // Note: We purposely hold this open until after the process has finished as
  // it simplifies client implentation. If we close it early, clients need to be
  // aware of and potentially handle a SIGPIPE.
  releaseFd.close();

  // Update the set of spawned processes.
  pgrp.remove(pid);
#if defined(_WIN32)
  PROCESS_MEMORY_COUNTERS counters;
  bool res =
      GetProcessTimes(pid, &creationTime, &exitTime, &stimeTicks, &utimeTicks);
  if (!res) {
    auto result = ProcessResult::makeCancelled();
    delegate.processHadError(ctx, handle,
                             Twine("unable to get statistics for process: ") +
                                 sys::strerror(GetLastError()) + ")");
    delegate.processFinished(ctx, handle, result);
    return;
  }
  // Each tick is 100ns
  uint64_t utime =
      ((uint64_t)utimeTicks.dwHighDateTime << 32 | utimeTicks.dwLowDateTime) /
      10;
  uint64_t stime =
      ((uint64_t)stimeTicks.dwHighDateTime << 32 | stimeTicks.dwLowDateTime) /
      10;
  GetProcessMemoryInfo(pid, &counters, sizeof(counters));

  // We report additional info in the tracing interval
  //   - user time, in µs
  //   - sys time, in µs
  //   - memory usage, in bytes

  // FIXME: We should report a statistic for how much output we read from the
  // subprocess (probably as a new point sample).

  // Notify of the process completion.
  ProcessStatus processStatus =
      (exitCode == 0) ? ProcessStatus::Succeeded : ProcessStatus::Failed;
  ProcessResult processResult(processStatus, exitCode, pid, utime, stime,
                              counters.PeakWorkingSetSize);
#else  // !defined(_WIN32)
  if (result == -1) {
    auto result = ProcessResult::makeFailed(exitCode);
    delegate.processHadError(ctx, handle,
                             Twine("unable to wait for process (") +
                                 strerror(errno) + ")");
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }

  // We report additional info in the tracing interval
  //   - user time, in µs
  //   - sys time, in µs
  //   - memory usage, in bytes
  uint64_t utime = (uint64_t(usage.ru_utime.tv_sec) * 1000000 +
                    uint64_t(usage.ru_utime.tv_usec));
  uint64_t stime = (uint64_t(usage.ru_stime.tv_sec) * 1000000 +
                    uint64_t(usage.ru_stime.tv_usec));

  // FIXME: We should report a statistic for how much output we read from the
  // subprocess (probably as a new point sample).

  // Notify of the process completion.
  bool cancelled = WIFSIGNALED(exitCode) && (WTERMSIG(exitCode) == SIGINT || WTERMSIG(exitCode) == SIGKILL);
  ProcessStatus processStatus = cancelled ? ProcessStatus::Cancelled : (exitCode == 0) ? ProcessStatus::Succeeded : ProcessStatus::Failed;
  ProcessResult processResult(processStatus, exitCode, pid, utime, stime,
                              usage.ru_maxrss);
#endif // else !defined(_WIN32)
  delegate.processFinished(ctx, handle, processResult);
  completionFn(processResult);
}